

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

int fits_read_fits_region(fitsfile *fptr,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  double *pdVar1;
  RgnShape *pRVar2;
  undefined4 uVar3;
  int iVar4;
  shapeType sVar5;
  SAORegion *Rgn_00;
  RgnShape *pRVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  char (*pacVar11) [71];
  char *pcVar12;
  double *pdVar13;
  WCSdata *pWVar14;
  WCSdata *pWVar15;
  char *__s2;
  double *pdVar16;
  ulong uVar17;
  double *pdVar18;
  long *naxes;
  bool bVar19;
  byte bVar20;
  double dVar21;
  double dVar22;
  anon_union_120_2_131c4ffb_for_param *local_340;
  int anynul;
  SAORegion **local_328;
  RgnShape *local_320;
  undefined4 local_314;
  double *local_310;
  double *local_308;
  int *local_300;
  double *local_2f8;
  WCSdata *local_2f0;
  anon_union_120_2_131c4ffb_for_param *local_2e8;
  double local_2e0;
  int icol [6];
  double Ypos;
  double Xpos;
  int local_2b0;
  int tstatus;
  char *local_2a8;
  int *local_2a0;
  char *cvalue;
  double Y;
  double X;
  RgnShape *local_280;
  long local_278;
  int idum;
  long icsize [6];
  char comment [73];
  char colname [6] [71];
  
  bVar20 = 0;
  pacVar11 = colname;
  memcpy(pacVar11,&DAT_0020eeb0,0x1aa);
  if (*status != 0) {
    return *status;
  }
  Rgn_00 = (SAORegion *)malloc(0x58);
  if (Rgn_00 == (SAORegion *)0x0) {
    ffpmsg("Couldn\'t allocate memory to hold Region file contents.");
    *status = 0x71;
    return 0x71;
  }
  Rgn_00->nShapes = 0;
  Rgn_00->Shapes = (RgnShape *)0x0;
  if ((wcs == (WCSdata *)0x0) || (wcs->exists == 0)) {
    (Rgn_00->wcs).exists = 0;
  }
  else {
    pWVar14 = wcs;
    pWVar15 = &Rgn_00->wcs;
    for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
      uVar3 = *(undefined4 *)&pWVar14->field_0x4;
      pWVar15->exists = pWVar14->exists;
      *(undefined4 *)&pWVar15->field_0x4 = uVar3;
      pWVar14 = (WCSdata *)((long)pWVar14 + (ulong)bVar20 * -0x10 + 8);
      pWVar15 = (WCSdata *)((long)pWVar15 + (ulong)bVar20 * -0x10 + 8);
    }
  }
  tstatus = 0;
  local_2f0 = wcs;
  for (lVar9 = 0; lVar9 != 0x14; lVar9 = lVar9 + 4) {
    ffgcno(fptr,0,*pacVar11,(int *)((long)icol + lVar9),&tstatus);
    pacVar11 = pacVar11 + 1;
  }
  if ((tstatus != 0) && (iVar4 = ffmnhd(fptr,2,"REGION",1,status), iVar4 != 0)) {
    pcVar12 = "Could not move to REGION extension.";
    goto LAB_001ef02f;
  }
  iVar4 = ffgky(fptr,0x1f,"NAXIS2",Rgn_00,comment,status);
  if (iVar4 != 0) {
    pcVar12 = "Could not read NAXIS2 keyword.";
    goto LAB_001ef02f;
  }
  pRVar6 = (RgnShape *)malloc((long)Rgn_00->nShapes * 0xa8);
  Rgn_00->Shapes = pRVar6;
  if (pRVar6 != (RgnShape *)0x0) {
    pcVar12 = "Could not find column.";
    lVar9 = 0;
    pacVar11 = colname;
    do {
      if (lVar9 + 4 == 0x18) {
        local_2b0 = ffgcno(fptr,0,colname[5],icol + 5,status);
        local_314 = (undefined4)CONCAT71((uint7)(uint3)((uint)local_2b0 >> 8),1);
        local_328 = Rgn;
        if ((Rgn_00->wcs).exists == 0) {
          local_300 = (int *)0x0;
        }
        else {
          piVar7 = (int *)malloc(0x48);
          if (piVar7 == (int *)0x0) {
            pcVar12 = "Failed to allocate memory for Region WCS data";
            goto LAB_001ef0e1;
          }
          *piVar7 = 1;
          local_320 = (RgnShape *)(piVar7 + 2);
          local_310 = (double *)(piVar7 + 4);
          local_2f8 = (double *)(piVar7 + 6);
          local_308 = (double *)(piVar7 + 8);
          iVar4 = ffgtcs(fptr,icol[0],icol[1],(double *)local_320,local_310,local_2f8,local_308,
                         (double *)(piVar7 + 10),(double *)(piVar7 + 0xc),(double *)(piVar7 + 0xe),
                         (char *)(piVar7 + 0x10),status);
          local_300 = piVar7;
          if (iVar4 == 0) {
            if (((*piVar7 != 0) && (local_2f0->exists != 0)) &&
               ((((1e-06 < ABS(*(double *)local_320 - local_2f0->xrefval) ||
                  ((((1e-06 < ABS(*local_310 - local_2f0->yrefval) ||
                     (1e-06 < ABS(*local_2f8 - local_2f0->xrefpix))) ||
                    (1e-06 < ABS(*local_308 - local_2f0->yrefpix))) ||
                   ((1e-06 < ABS(*(double *)(piVar7 + 10) - local_2f0->xinc) ||
                    (1e-06 < ABS(*(double *)(piVar7 + 0xc) - local_2f0->yinc))))))) ||
                 (1e-06 < ABS(*(double *)(piVar7 + 0xe) - local_2f0->rot))) ||
                (iVar4 = strcmp((char *)(piVar7 + 0x10),local_2f0->type), iVar4 == 0)))) {
              local_314 = 0;
            }
          }
          else {
            *piVar7 = 0;
            *status = 0;
          }
        }
        naxes = icsize;
        lVar9 = 0;
        goto LAB_001ef1d9;
      }
      iVar4 = ffgcno(fptr,0,*pacVar11,(int *)((long)icol + lVar9),status);
      lVar9 = lVar9 + 4;
      pacVar11 = pacVar11 + 1;
    } while (iVar4 == 0);
    goto LAB_001ef02f;
  }
  pcVar12 = "Failed to allocate memory for Region data";
LAB_001ef0e1:
  ffpmsg(pcVar12);
  *status = 0x71;
  goto LAB_001ef03c;
LAB_001ef283:
  pcVar12 = "Could not read shape.";
  if ((long)Rgn_00->nShapes < (long)pdVar18) goto LAB_001ef037;
  pRVar2 = Rgn_00->Shapes;
  pRVar6 = pRVar2 + (long)pdVar18;
  local_2e8 = &pRVar2[(long)pdVar18 + -1].param;
  for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
    *(undefined8 *)(&pRVar2->sign + lVar10 * 8 + lVar9) = 0;
  }
  pRVar6[-1].param.gen.a = 0.0;
  pRVar6[-1].param.gen.b = 0.0;
  pRVar6[-1].param.gen.sinT = 0.0;
  pRVar6[-1].param.gen.cosT = 0.0;
  local_320 = pRVar6;
  local_310 = pdVar18;
  local_278 = lVar9;
  iVar4 = ffgcvs(fptr,icol[2],(LONGLONG)pdVar18,1,1," ",&cvalue,&anynul,status);
  if (iVar4 != 0) goto LAB_001ef02f;
  local_280 = pRVar6 + -1;
  local_280->sign = '\x01';
  pcVar12 = cvalue;
  if (*cvalue == '!') {
    local_280->sign = '\0';
    pcVar12 = cvalue + 1;
  }
  __s2 = "POINT";
  for (lVar9 = 0; pRVar6 = local_320, lVar9 != 0x44; lVar9 = lVar9 + 4) {
    iVar4 = strcmp(pcVar12,__s2);
    if (iVar4 == 0) {
      local_320[-1].shape = *(shapeType *)((long)&DAT_0020f520 + lVar9);
    }
    __s2 = __s2 + 0x47;
  }
  if (local_320[-1].shape == poly_rgn) {
    local_340 = (anon_union_120_2_131c4ffb_for_param *)
                calloc(CONCAT44(icsize[0]._4_4_,(int)icsize[0]) * 2,8);
    pRVar6[-1].param.poly.Pts = (double *)local_340;
    if (local_340 == (anon_union_120_2_131c4ffb_for_param *)0x0) {
      pcVar12 = "Could not allocate memory to hold polygon parameters";
      goto LAB_001ef0e1;
    }
    (local_2e8->poly).nPts = (int)icsize[0] * 2;
    uVar8 = (int)icsize[0] * 2 >> 1;
  }
  else {
    uVar8 = (local_320[-1].shape == rectangle_rgn) + 1;
    local_340 = local_2e8;
  }
  local_2f8 = (double *)(ulong)uVar8;
  pdVar18 = (double *)0x0;
  if (0 < (int)uVar8) {
    pdVar18 = local_2f8;
  }
  pdVar13 = (double *)0x0;
  pdVar16 = local_308;
  dVar21 = local_2e0;
  do {
    do {
      do {
        local_2e0 = dVar21;
        local_308 = pdVar16;
        pdVar16 = local_2f8;
        if (pdVar18 == pdVar13) goto LAB_001ef542;
        pdVar16 = (double *)((long)pdVar13 + 1);
        iVar4 = ffgcvd(fptr,icol[0],(LONGLONG)local_310,(LONGLONG)pdVar16,1,-9.1191291391491e-36,
                       (double *)local_340,&anynul,status);
        if (iVar4 != 0) {
          pcVar12 = "Failed to read X column for polygon region";
          Rgn = local_328;
          goto LAB_001ef02f;
        }
        if (((local_340->gen).p[0] == -9.1191291391491e-36) && (!NAN((local_340->gen).p[0])))
        goto LAB_001ef532;
        iVar4 = ffgcvd(fptr,icol[1],(LONGLONG)local_310,(LONGLONG)pdVar16,1,-9.1191291391491e-36,
                       (local_340->gen).p + 1,&anynul,status);
        if (iVar4 != 0) {
          pcVar12 = "Failed to read Y column for polygon region";
          Rgn = local_328;
          goto LAB_001ef02f;
        }
        dVar22 = (local_340->gen).p[1];
        if ((dVar22 == -9.1191291391491e-36) && (!NAN(dVar22))) goto LAB_001ef532;
        pdVar1 = (double *)(local_340->gen).p[0];
        local_340 = (anon_union_120_2_131c4ffb_for_param *)((local_340->gen).p + 2);
        bVar19 = pdVar13 == (double *)0x0;
        pdVar13 = pdVar16;
        pdVar16 = pdVar1;
        dVar21 = dVar22;
      } while (bVar19);
      pdVar16 = local_308;
      dVar21 = local_2e0;
    } while (((double)local_308 != (double)pdVar1) ||
            (NAN((double)local_308) || NAN((double)pdVar1)));
  } while ((local_2e0 != dVar22) || (NAN(local_2e0) || NAN(dVar22)));
LAB_001ef532:
  (local_2e8->poly).nPts = (int)pdVar13 * 2;
  pdVar16 = pdVar13;
LAB_001ef542:
  Rgn = local_328;
  if ((char)local_314 == '\0') {
    pdVar18 = (double *)((long)local_340 + (long)((int)pdVar16 * 2) * -8);
    local_308 = (double *)*pdVar18;
    local_2e0 = pdVar18[1];
    uVar17 = (ulong)pdVar16 & 0xffffffff;
    if ((int)pdVar16 < 1) {
      uVar17 = 0;
    }
    pdVar18 = pdVar18 + 1;
    pdVar13 = (double *)(uVar17 + 1);
    while ((double *)((long)pdVar13 + -1) != (double *)0x0) {
      local_2f8 = (double *)((long)pdVar13 + -1);
      ffwldp(pdVar18[-1],*pdVar18,*(double *)(local_300 + 2),*(double *)(local_300 + 4),
             *(double *)(local_300 + 6),*(double *)(local_300 + 8),*(double *)(local_300 + 10),
             *(double *)(local_300 + 0xc),*(double *)(local_300 + 0xe),(char *)local_2a0,&Xpos,&Ypos
             ,status);
      ffxypx(Xpos,Ypos,local_2f0->xrefval,local_2f0->yrefval,local_2f0->xrefpix,local_2f0->yrefpix,
             local_2f0->xinc,local_2f0->yinc,local_2f0->rot,local_2a8,pdVar18 + -1,pdVar18,status);
      pdVar18 = pdVar18 + 2;
      pdVar13 = local_2f8;
      if (*status != 0) goto LAB_001efab0;
    }
  }
  pRVar6 = local_320;
  sVar5 = local_320[-1].shape;
  uVar8 = sVar5 - circle_rgn;
  if ((uVar8 < 9) && ((0x1bfU >> (uVar8 & 0x1f) & 1) != 0)) {
    uVar17 = (ulong)*(uint *)(&DAT_0020f564 + (ulong)uVar8 * 4);
    iVar4 = ffgcvd(fptr,icol[3],(LONGLONG)local_310,1,uVar17,0.0,(double *)local_340,&anynul,status)
    ;
    if (iVar4 != 0) {
      pcVar12 = "Failed to read R column for region";
      goto LAB_001ef02f;
    }
    if ((char)local_314 == '\0') {
      while (iVar4 = (int)uVar17, uVar17 = (ulong)(iVar4 - 1), pRVar6 = local_320, iVar4 != 0) {
        Y = (local_340->gen).p[0] + local_2e0;
        X = (double)local_308;
        ffwldp((double)local_308,Y,*(double *)(local_300 + 2),*(double *)(local_300 + 4),
               *(double *)(local_300 + 6),*(double *)(local_300 + 8),*(double *)(local_300 + 10),
               *(double *)(local_300 + 0xc),*(double *)(local_300 + 0xe),(char *)local_2a0,&Xpos,
               &Ypos,status);
        ffxypx(Xpos,Ypos,local_2f0->xrefval,local_2f0->yrefval,local_2f0->xrefpix,local_2f0->yrefpix
               ,local_2f0->xinc,local_2f0->yinc,local_2f0->rot,local_2a8,&X,&Y,status);
        if (*status != 0) goto LAB_001efab0;
        dVar21 = X - (local_2e8->gen).p[0];
        dVar22 = Y - (local_2e8->gen).p[1];
        (local_340->gen).p[0] = SQRT(dVar22 * dVar22 + dVar21 * dVar21);
        local_340 = (anon_union_120_2_131c4ffb_for_param *)((long)local_340 + 8);
      }
    }
    else {
      local_340 = (anon_union_120_2_131c4ffb_for_param *)((long)local_340 + uVar17 * 8);
    }
    sVar5 = pRVar6[-1].shape;
  }
  uVar8 = sVar5 - ellipse_rgn;
  if ((uVar8 < 7) && ((0x6fU >> (uVar8 & 0x1f) & 1) != 0)) {
    uVar8 = *(uint *)(&DAT_0020f588 + (ulong)uVar8 * 4);
    iVar4 = ffgcvd(fptr,icol[4],(LONGLONG)local_310,1,(ulong)uVar8,0.0,(double *)local_340,&anynul,
                   status);
    if (iVar4 != 0) {
      pcVar12 = "Failed to read ROTANG column for region";
      goto LAB_001ef02f;
    }
    if ((char)local_314 == '\0') {
      dVar21 = local_2f0->rot;
      dVar22 = *(double *)(local_300 + 0xe);
      for (lVar9 = 0; uVar8 != (uint)lVar9; lVar9 = lVar9 + 1) {
        *(double *)((long)local_340 + lVar9 * 8) =
             *(double *)((long)local_340 + lVar9 * 8) + (dVar21 - dVar22);
      }
    }
  }
  pdVar18 = local_310;
  if (local_2b0 == 0) {
    iVar4 = ffgcv(fptr,0x1f,icol[5],(LONGLONG)local_310,1,1,(void *)0x0,&local_320[-1].comp,&anynul,
                  status);
    if (iVar4 != 0) {
      pcVar12 = "Failed to read COMPONENT column for region";
      goto LAB_001ef02f;
    }
  }
  else {
    local_320[-1].comp = 1;
  }
  fits_setup_shape(local_280);
  pdVar18 = (double *)((long)pdVar18 + 1);
  lVar9 = local_278 + 0xa8;
  goto LAB_001ef283;
LAB_001efab0:
  pcVar12 = "Failed to transform coordinates";
  goto LAB_001ef02f;
  while( true ) {
    iVar4 = ffgtdm(fptr,icol[lVar9],1,&idum,naxes,status);
    lVar9 = lVar9 + 1;
    naxes = naxes + 1;
    if (iVar4 != 0) break;
LAB_001ef1d9:
    if (lVar9 == 6) {
      cvalue = (char *)malloc(0x48);
      local_2a0 = local_300 + 0x10;
      local_2a8 = local_2f0->type;
      local_308 = (double *)0x0;
      pdVar18 = (double *)0x1;
      lVar9 = 0x30;
      local_2e0 = 0.0;
      Rgn = local_328;
      goto LAB_001ef283;
    }
  }
  pcVar12 = "Could not find vector size of column.";
  Rgn = local_328;
LAB_001ef02f:
  ffpmsg(pcVar12);
LAB_001ef037:
  if (*status == 0) {
    *Rgn = Rgn_00;
    goto LAB_001ef061;
  }
LAB_001ef03c:
  fits_free_region(Rgn_00);
LAB_001ef061:
  ffclos(fptr,status);
  return *status;
}

Assistant:

int fits_read_fits_region ( fitsfile *fptr, 
			    WCSdata *wcs, 
			    SAORegion **Rgn, 
			    int *status)
/*  Read regions from a FITS region extension and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{

  int i, j, icol[6], idum, anynul, npos;
  int dotransform, got_component = 1, tstatus;
  long icsize[6];
  double X, Y, Theta, Xsave = 0, Ysave = 0, Xpos, Ypos;
  double *coords;
  char *cvalue, *cvalue2;
  char comment[FLEN_COMMENT];
  char colname[6][FLEN_VALUE] = {"X", "Y", "SHAPE", "R", "ROTANG", "COMPONENT"};
  char shapename[17][FLEN_VALUE] = {"POINT","CIRCLE","ELLIPSE","ANNULUS",
				    "ELLIPTANNULUS","BOX","ROTBOX","BOXANNULUS",
				    "RECTANGLE","ROTRECTANGLE","POLYGON","PIE",
				    "SECTOR","DIAMOND","RHOMBUS","ROTDIAMOND",
				    "ROTRHOMBUS"};
  int shapetype[17] = {point_rgn, circle_rgn, ellipse_rgn, annulus_rgn, 
		       elliptannulus_rgn, box_rgn, box_rgn, boxannulus_rgn, 
		       rectangle_rgn, rectangle_rgn, poly_rgn, sector_rgn, 
		       sector_rgn, diamond_rgn, diamond_rgn, diamond_rgn, 
		       diamond_rgn};
  SAORegion *aRgn;
  RgnShape *newShape;
  WCSdata *regwcs = 0;

  if ( *status ) return( *status );

  aRgn = (SAORegion *)malloc( sizeof(SAORegion) );
  if( ! aRgn ) {
    ffpmsg("Couldn't allocate memory to hold Region file contents.");
    return(*status = MEMORY_ALLOCATION );
  }
  aRgn->nShapes    =    0;
  aRgn->Shapes     = NULL;
  if( wcs && wcs->exists )
    aRgn->wcs = *wcs;
  else
    aRgn->wcs.exists = 0;

  /* See if we are already positioned to a region extension, else */
  /* move to the REGION extension (file is already open). */

  tstatus = 0;
  for (i=0; i<5; i++) {
    ffgcno(fptr, CASEINSEN, colname[i], &icol[i], &tstatus);
  }

  if (tstatus) {
    /* couldn't find the required columns, so search for "REGION" extension */
    if ( ffmnhd(fptr, BINARY_TBL, "REGION", 1, status) ) {
      ffpmsg("Could not move to REGION extension.");
      goto error;
    }
  }

  /* get the number of shapes and allocate memory */

  if ( ffgky(fptr, TINT, "NAXIS2", &aRgn->nShapes, comment, status) ) {
    ffpmsg("Could not read NAXIS2 keyword.");
    goto error;
  }

  aRgn->Shapes = (RgnShape *) malloc(aRgn->nShapes * sizeof(RgnShape));
  if ( !aRgn->Shapes ) {
    ffpmsg( "Failed to allocate memory for Region data");
    *status = MEMORY_ALLOCATION;
    goto error;
  }

  /* get the required column numbers */

  for (i=0; i<5; i++) {
    if ( ffgcno(fptr, CASEINSEN, colname[i], &icol[i], status) ) {
      ffpmsg("Could not find column.");
      goto error;
    }
  }

  /* try to get the optional column numbers */

  if ( ffgcno(fptr, CASEINSEN, colname[5], &icol[5], status) ) {
       got_component = 0;
  }

  /* if there was input WCS then read the WCS info for the region in case they */
  /* are different and we have to transform */

  dotransform = 0;
  if ( aRgn->wcs.exists ) {
    regwcs = (WCSdata *) malloc ( sizeof(WCSdata) );
    if ( !regwcs ) {
      ffpmsg( "Failed to allocate memory for Region WCS data");
      *status = MEMORY_ALLOCATION;
      goto error;
    }

    regwcs->exists = 1;
    if ( ffgtcs(fptr, icol[0], icol[1], &regwcs->xrefval,  &regwcs->yrefval,
		&regwcs->xrefpix, &regwcs->yrefpix, &regwcs->xinc, &regwcs->yinc,
		&regwcs->rot, regwcs->type, status) ) {
      regwcs->exists = 0;
      *status = 0;
    }

    if ( regwcs->exists && wcs->exists ) {
      if ( fabs(regwcs->xrefval-wcs->xrefval) > 1.0e-6 ||
	   fabs(regwcs->yrefval-wcs->yrefval) > 1.0e-6 ||
	   fabs(regwcs->xrefpix-wcs->xrefpix) > 1.0e-6 ||
	   fabs(regwcs->yrefpix-wcs->yrefpix) > 1.0e-6 ||
	   fabs(regwcs->xinc-wcs->xinc) > 1.0e-6 ||
	   fabs(regwcs->yinc-wcs->yinc) > 1.0e-6 ||
	   fabs(regwcs->rot-wcs->rot) > 1.0e-6 ||
	   !strcmp(regwcs->type,wcs->type) ) dotransform = 1;
    }
  }

  /* get the sizes of the X, Y, R, and ROTANG vectors */

  for (i=0; i<6; i++) {
    if ( ffgtdm(fptr, icol[i], 1, &idum, &icsize[i], status) ) {
      ffpmsg("Could not find vector size of column.");
      goto error;
    }
  }

  cvalue = (char *) malloc ((FLEN_VALUE+1)*sizeof(char));

  /* loop over the shapes - note 1-based counting for rows in FITS files */

  for (i=1; i<=aRgn->nShapes; i++) {

    newShape = &aRgn->Shapes[i-1];
    for (j=0; j<8; j++) newShape->param.gen.p[j] = 0.0;
    newShape->param.gen.a = 0.0;
    newShape->param.gen.b = 0.0;
    newShape->param.gen.sinT = 0.0;
    newShape->param.gen.cosT = 0.0;

    /* get the shape */

    if ( ffgcvs(fptr, icol[2], i, 1, 1, " ", &cvalue, &anynul, status) ) {
      ffpmsg("Could not read shape.");
      goto error;
    }

    /* set include or exclude */

    newShape->sign = 1;
    cvalue2 = cvalue;
    if ( !strncmp(cvalue,"!",1) ) {
      newShape->sign = 0;
      cvalue2++;
    }

    /* set the shape type */

    for (j=0; j<17; j++) {
      if ( !strcmp(cvalue2, shapename[j]) ) newShape->shape = shapetype[j];
    }

    /* allocate memory for polygon case and set coords pointer */

    if ( newShape->shape == poly_rgn ) {
      newShape->param.poly.Pts = (double *) calloc (2*icsize[0], sizeof(double));
      if ( !newShape->param.poly.Pts ) {
	ffpmsg("Could not allocate memory to hold polygon parameters" );
	*status = MEMORY_ALLOCATION;
	goto error;
      }
      newShape->param.poly.nPts = 2*icsize[0];
      coords = newShape->param.poly.Pts;
    } else {
      coords = newShape->param.gen.p;
    }


  /* read X and Y. Polygon and Rectangle require special cases */

    npos = 1;
    if ( newShape->shape == poly_rgn ) npos = newShape->param.poly.nPts/2;
    if ( newShape->shape == rectangle_rgn ) npos = 2;

    for (j=0; j<npos; j++) {
      if ( ffgcvd(fptr, icol[0], i, j+1, 1, DOUBLENULLVALUE, coords, &anynul, status) ) {
	ffpmsg("Failed to read X column for polygon region");
	goto error;
      }
      if (*coords == DOUBLENULLVALUE) {  /* check for null value end of array marker */
        npos = j;
	newShape->param.poly.nPts = npos * 2;
	break;
      }
      coords++;
      
      if ( ffgcvd(fptr, icol[1], i, j+1, 1, DOUBLENULLVALUE, coords, &anynul, status) ) {
	ffpmsg("Failed to read Y column for polygon region");
	goto error;
      }
      if (*coords == DOUBLENULLVALUE) { /* check for null value end of array marker */
        npos = j;
	newShape->param.poly.nPts = npos * 2;
        coords--;
	break;
      }
      coords++;
 
      if (j == 0) {  /* save the first X and Y coordinate */
        Xsave = *(coords - 2);
	Ysave = *(coords - 1);
      } else if ((Xsave == *(coords - 2)) && (Ysave == *(coords - 1)) ) {
        /* if point has same coordinate as first point, this marks the end of the array */
        npos = j + 1;
	newShape->param.poly.nPts = npos * 2;
	break;
      }
    }

    /* transform positions if the region and input wcs differ */

    if ( dotransform ) {

      coords -= npos*2;
      Xsave = coords[0];
      Ysave = coords[1];
      for (j=0; j<npos; j++) {
	ffwldp(coords[2*j], coords[2*j+1], regwcs->xrefval, regwcs->yrefval, regwcs->xrefpix,
	       regwcs->yrefpix, regwcs->xinc, regwcs->yinc, regwcs->rot,
	       regwcs->type, &Xpos, &Ypos, status);
	ffxypx(Xpos, Ypos, wcs->xrefval, wcs->yrefval, wcs->xrefpix,
	       wcs->yrefpix, wcs->xinc, wcs->yinc, wcs->rot,
	       wcs->type, &coords[2*j], &coords[2*j+1], status);
	if ( *status ) {
	  ffpmsg("Failed to transform coordinates");
	  goto error;
	}
      }
      coords += npos*2;
    }

  /* read R. Circle requires one number; Box, Diamond, Ellipse, Annulus, Sector 
     and Panda two; Boxannulus and Elliptannulus four; Point, Rectangle and 
     Polygon none. */

    npos = 0;
    switch ( newShape->shape ) {
    case circle_rgn: 
      npos = 1;
      break;
    case box_rgn:
    case diamond_rgn:
    case ellipse_rgn:
    case annulus_rgn:
    case sector_rgn:
      npos = 2;
      break;
    case boxannulus_rgn:
    case elliptannulus_rgn:
      npos = 4;
      break;
    default:
      break;
    }

    if ( npos > 0 ) {
      if ( ffgcvd(fptr, icol[3], i, 1, npos, 0.0, coords, &anynul, status) ) {
	ffpmsg("Failed to read R column for region");
	goto error;
      }

    /* transform lengths if the region and input wcs differ */

      if ( dotransform ) {
	for (j=0; j<npos; j++) {
	  Y = Ysave + (*coords);
	  X = Xsave;
	  ffwldp(X, Y, regwcs->xrefval, regwcs->yrefval, regwcs->xrefpix,
		 regwcs->yrefpix, regwcs->xinc, regwcs->yinc, regwcs->rot,
		 regwcs->type, &Xpos, &Ypos, status);
	  ffxypx(Xpos, Ypos, wcs->xrefval, wcs->yrefval, wcs->xrefpix,
		 wcs->yrefpix, wcs->xinc, wcs->yinc, wcs->rot,
		 wcs->type, &X, &Y, status);
	  if ( *status ) {
	    ffpmsg("Failed to transform coordinates");
	    goto error;
	  }
	  *(coords++) = sqrt(pow(X-newShape->param.gen.p[0],2)+pow(Y-newShape->param.gen.p[1],2));
	}
      } else {
	coords += npos;
      }
    }

  /* read ROTANG. Requires two values for Boxannulus, Elliptannulus, Sector, 
     Panda; one for Box, Diamond, Ellipse; and none for Circle, Point, Annulus, 
     Rectangle, Polygon */

    npos = 0;
    switch ( newShape->shape ) {
    case box_rgn:
    case diamond_rgn:
    case ellipse_rgn:
      npos = 1;
      break;
    case boxannulus_rgn:
    case elliptannulus_rgn:
    case sector_rgn:
      npos = 2;
      break;
    default:
     break;
    }

    if ( npos > 0 ) {
      if ( ffgcvd(fptr, icol[4], i, 1, npos, 0.0, coords, &anynul, status) ) {
	ffpmsg("Failed to read ROTANG column for region");
	goto error;
      }

    /* transform angles if the region and input wcs differ */

      if ( dotransform ) {
	Theta = (wcs->rot) - (regwcs->rot);
	for (j=0; j<npos; j++) *(coords++) += Theta;
      } else {
	coords += npos;
      }
    }

  /* read the component number */

    if (got_component) {
      if ( ffgcv(fptr, TINT, icol[5], i, 1, 1, 0, &newShape->comp, &anynul, status) ) {
        ffpmsg("Failed to read COMPONENT column for region");
        goto error;
      }
    } else {
      newShape->comp = 1;
    }


    /* do some precalculations to speed up tests */

    fits_setup_shape(newShape);

    /* end loop over shapes */

  }

error:

   if( *status )
      fits_free_region( aRgn );
   else
      *Rgn = aRgn;

   ffclos(fptr, status);

   return( *status );
}